

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::KahanAvgState,double,duckdb::KahanAverageOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  long *plVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  KahanAvgState **states_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar2 = (double *)input->data;
      states_00 = (KahanAvgState **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::KahanAvgState,double,duckdb::KahanAverageOperation>
                (pdVar2,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    pdVar2 = (double *)input->data;
    plVar3 = *(long **)states->data;
    *plVar3 = *plVar3 + count;
    auVar9._8_4_ = (int)(count >> 0x20);
    auVar9._0_8_ = count;
    auVar9._12_4_ = 0x45300000;
    dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)count) - 4503599627370496.0)) * *pdVar2 -
             (double)plVar3[2];
    dVar11 = (double)plVar3[1] + dVar10;
    plVar3[2] = (long)((dVar11 - (double)plVar3[1]) - dVar10);
    plVar3[1] = (long)dVar11;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_b8.sel)->sel_vector;
      psVar5 = (local_70.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (psVar4 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar4[iVar6];
        }
        iVar8 = iVar6;
        if (psVar5 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar5[iVar6];
        }
        plVar3 = *(long **)(local_70.data + iVar8 * 8);
        *plVar3 = *plVar3 + 1;
        dVar10 = (double)plVar3[1] + (*(double *)(local_b8.data + iVar7 * 8) - (double)plVar3[2]);
        plVar3[2] = (long)((dVar10 - (double)plVar3[1]) -
                          (*(double *)(local_b8.data + iVar7 * 8) - (double)plVar3[2]));
        plVar3[1] = (long)dVar10;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (count != 0) {
    psVar4 = (local_b8.sel)->sel_vector;
    psVar5 = (local_70.sel)->sel_vector;
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if (psVar4 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar4[iVar6];
      }
      iVar8 = iVar6;
      if (psVar5 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar5[iVar6];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] >>
           (iVar7 & 0x3f) & 1) != 0) {
        plVar3 = *(long **)(local_70.data + iVar8 * 8);
        *plVar3 = *plVar3 + 1;
        dVar10 = (double)plVar3[1] + (*(double *)(local_b8.data + iVar7 * 8) - (double)plVar3[2]);
        plVar3[2] = (long)((dVar10 - (double)plVar3[1]) -
                          (*(double *)(local_b8.data + iVar7 * 8) - (double)plVar3[2]));
        plVar3[1] = (long)dVar10;
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}